

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureArrayPrototypeValuesFunction(JavascriptLibrary *this)

{
  bool bVar1;
  RuntimeFunction *ptr;
  
  if ((this->arrayPrototypeValuesFunction).ptr == (JavascriptFunction *)0x0) {
    bVar1 = ScriptContext::IsJsBuiltInEnabled((this->super_JavascriptLibraryBase).scriptContext.ptr)
    ;
    if (bVar1) {
      EnsureBuiltInEngineIsReady
                (Array_prototype,(this->super_JavascriptLibraryBase).scriptContext.ptr);
    }
    else {
      ptr = DefaultCreateFunction
                      (this,(FunctionInfo *)JavascriptArray::EntryInfo::Values,0,
                       (DynamicObject *)0x0,(DynamicType *)0x0,399);
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
                (&this->arrayPrototypeValuesFunction,&ptr->super_JavascriptFunction);
    }
  }
  return (this->arrayPrototypeValuesFunction).ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureArrayPrototypeValuesFunction()
    {
        if (arrayPrototypeValuesFunction == nullptr)
        {
#ifndef ENABLE_JS_BUILTINS
            arrayPrototypeValuesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Values, 0, nullptr, nullptr, PropertyIds::values);
#else
            if (!scriptContext->IsJsBuiltInEnabled())
            {
                arrayPrototypeValuesFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Values, 0, nullptr, nullptr, PropertyIds::values);
            }
            else
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
            }
#endif
        }
        return arrayPrototypeValuesFunction;
    }